

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O0

void __thiscall
bssl::gtest_suite_PkitsTest13NameConstraints_::
Section13ValidDNSnameConstraintsTest32<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section13ValidDNSnameConstraintsTest32
          (Section13ValidDNSnameConstraintsTest32<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  Section13ValidDNSnameConstraintsTest32<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
  *this_local;
  
  ~Section13ValidDNSnameConstraintsTest32(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest13NameConstraints,
                     Section13ValidDNSnameConstraintsTest32) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "nameConstraintsDNS2CACert",
                               "ValidDNSnameConstraintsTest32EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "nameConstraintsDNS2CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.13.32";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}